

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqliteOsOpen(unqlite_vfs *pVfs,SyMemBackend *pAlloc,char *zPath,unqlite_file **ppOut,uint flags
                 )

{
  int iVar1;
  unqlite_file *pSrc;
  
  *ppOut = (unqlite_file *)0x0;
  if (zPath == (char *)0x0) {
    iVar1 = -3;
  }
  else {
    pSrc = (unqlite_file *)SyMemBackendAlloc(pAlloc,pVfs->szOsFile + 8);
    if (pSrc == (unqlite_file *)0x0) {
      iVar1 = -1;
    }
    else {
      SyZero(pSrc,pVfs->szOsFile + 8);
      iVar1 = (*pVfs->xOpen)(pVfs,zPath,pSrc,flags);
      if (iVar1 != 0) {
        SyMemBackendFree(pAlloc,pSrc);
        pSrc = (unqlite_file *)0x0;
      }
      *ppOut = pSrc;
    }
  }
  return iVar1;
}

Assistant:

UNQLITE_PRIVATE int unqliteOsOpen(
  unqlite_vfs *pVfs,
  SyMemBackend *pAlloc,
  const char *zPath, 
  unqlite_file **ppOut, 
  unsigned int flags 
)
{
	unqlite_file *pFile;
	int rc;
	*ppOut = 0;
	if( zPath == 0 ){
		/* May happen if dealing with an in-memory database */
		return SXERR_EMPTY;
	}
	/* Allocate a new instance */
	pFile = (unqlite_file *)SyMemBackendAlloc(pAlloc,sizeof(unqlite_file)+pVfs->szOsFile);
	if( pFile == 0 ){
		return UNQLITE_NOMEM;
	}
	/* Zero the structure */
	SyZero(pFile,sizeof(unqlite_file)+pVfs->szOsFile);
	/* Invoke the xOpen method of the underlying VFS */
	rc = pVfs->xOpen(pVfs, zPath, pFile, flags);
	if( rc != UNQLITE_OK ){
		SyMemBackendFree(pAlloc,pFile);
		pFile = 0;
	}
	*ppOut = pFile;
	return rc;
}